

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_5c268::MapDrivePlugIn::regenerateMap(MapDrivePlugIn *this)

{
  ulong *puVar1;
  uint uVar2;
  TerrainMap *pTVar3;
  _Bit_type *p_Var4;
  MapDriver *pMVar5;
  PolylineSegmentedPathwaySegmentRadii *this_00;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  size_type sVar13;
  uint uVar14;
  ulong uVar15;
  size_type segmentIndex;
  GCRoute *path;
  int j;
  uint uVar16;
  long lVar17;
  size_type sVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  float r;
  undefined4 extraout_var;
  
  pTVar3 = this->vehicle->map;
  uVar2 = pTVar3->resolution;
  if (0 < (int)uVar2) {
    p_Var4 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar15 = 0;
    do {
      iVar7 = (int)uVar15;
      uVar16 = 0;
      do {
        bVar6 = (byte)uVar15 & 0x3f;
        puVar1 = p_Var4 + (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        uVar16 = uVar16 + 1;
        uVar15 = (ulong)((int)uVar15 + uVar2);
      } while (uVar2 != uVar16);
      uVar16 = iVar7 + 1;
      uVar15 = (ulong)uVar16;
    } while (uVar16 != uVar2);
  }
  if (this->useRandomRocks == true) {
    iVar7 = rand();
    iVar7 = (int)((float)iVar7 * 4.656613e-10 * 100.0 + 50.0);
    if (0 < iVar7) {
      iVar19 = 0;
      do {
        iVar8 = rand();
        iVar9 = rand();
        iVar10 = rand();
        iVar10 = (int)((float)iVar10 * 4.656613e-10 * 10.0 + 0.0);
        if (0 < iVar10) {
          do {
            iVar11 = rand();
            iVar12 = rand();
            iVar21 = (int)((float)iVar11 * 4.656613e-10 * 4.0 + 0.0) +
                     (int)((float)iVar8 * 4.656613e-10 * (float)(int)(uVar2 - 4) + 0.0);
            iVar12 = ((int)((float)iVar12 * 4.656613e-10 * 4.0 + 0.0) +
                     (int)((float)iVar9 * 4.656613e-10 * (float)(int)(uVar2 - 4) + 0.0)) *
                     pTVar3->resolution;
            iVar11 = iVar21 + iVar12;
            iVar12 = iVar12 + iVar21 + 0x3f;
            if (-1 < iVar11) {
              iVar12 = iVar11;
            }
            puVar1 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (long)(iVar12 >> 6) +
                     (ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) +
                     0xffffffffffffffff;
            *puVar1 = *puVar1 | 1L << ((byte)iVar11 & 0x3f);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != iVar7);
    }
  }
  pMVar5 = this->vehicle;
  pTVar3 = pMVar5->map;
  uVar2 = pTVar3->resolution;
  iVar19 = (int)(uVar2 - ((int)uVar2 >> 4)) >> 1;
  iVar7 = (int)(((int)uVar2 >> 4) + uVar2) >> 1;
  if (iVar19 <= iVar7) {
    p_Var4 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar17 = (long)iVar19;
    iVar9 = (iVar7 + 1) - iVar19;
    uVar20 = ((long)(int)uVar2 + 1) * lVar17;
    iVar8 = iVar9;
    uVar15 = uVar20;
    do {
      do {
        iVar10 = (int)uVar20;
        iVar11 = iVar10 + 0x3f;
        if (-1 < iVar10) {
          iVar11 = iVar10;
        }
        bVar6 = (byte)uVar20 & 0x3f;
        puVar1 = p_Var4 + (long)(iVar11 >> 6) +
                          (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff;
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        uVar20 = uVar20 + (long)(int)uVar2;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      lVar17 = lVar17 + 1;
      uVar20 = uVar15 + 1;
      iVar8 = iVar9;
      uVar15 = uVar20;
    } while (iVar7 + 1 != (int)lVar17);
  }
  iVar8 = (anonymous_namespace)::MapDriver::demoSelect;
  if ((anonymous_namespace)::MapDriver::demoSelect < 2) {
    if ((int)uVar2 < 1) {
      return;
    }
    p_Var4 = (pTVar3->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    iVar9 = -uVar2;
    uVar16 = 0;
    do {
      iVar9 = iVar9 + 1;
      iVar10 = 0;
      uVar14 = uVar16;
      do {
        iVar11 = iVar10 + -1;
        if (((((uVar16 == 0) || (iVar10 == 0)) || (uVar16 == uVar2 - 1)) || (uVar2 + iVar10 == 1))
           || (((iVar7 < (int)uVar16 || (int)uVar16 < iVar19) &&
                ((int)uVar16 < (int)(uVar2 - ((int)uVar2 >> 3)) && (int)uVar2 >> 3 < (int)uVar16) &&
               ((uVar16 + iVar10 == 0 || (iVar9 == iVar10)))))) {
          puVar1 = p_Var4 + (uVar14 >> 6);
          *puVar1 = *puVar1 | 1L << ((byte)uVar14 & 0x3f);
        }
        uVar14 = uVar14 + uVar2;
        iVar10 = iVar11;
      } while (uVar2 + iVar11 != 0);
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar2);
  }
  if (iVar8 == 2) {
    iVar7 = (*(pMVar5->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
    sVar13 = CONCAT44(extraout_var,iVar7);
    segmentIndex = 0;
    sVar18 = sVar13 - 1;
    if (this->vehicle->pathFollowDirection < 1) {
      sVar18 = segmentIndex;
      segmentIndex = sVar13 - 1;
    }
    r = OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius(this->vehicle->path,sVar18);
    if (sVar13 != 0) {
      sVar18 = 0;
      do {
        this_00 = this->vehicle->path;
        iVar7 = rand();
        OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
                  (this_00,sVar18,(float)iVar7 * 4.656613e-10 * 15.0 + 4.0);
        sVar18 = sVar18 + 1;
      } while (sVar13 != sVar18);
    }
    OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
              (this->vehicle->path,segmentIndex,r);
    if ((this->usePathFences == true) && ((anonymous_namespace)::MapDriver::demoSelect == 2)) {
      drawPathFencesOnMap((MapDrivePlugIn *)this->vehicle->map,(TerrainMap *)this->vehicle->path,
                          path);
      return;
    }
  }
  return;
}

Assistant:

void regenerateMap (void)
	{
	    // regenerate map: clear and add random "rocks"
	    vehicle->map->clear();
	    drawRandomClumpsOfRocksOnMap (*vehicle->map);
	    clearCenterOfMap (*vehicle->map);

	    // draw fences for first two demo modes
	    if (vehicle->demoSelect < 2) drawBoundaryFencesOnMap (*vehicle->map);

	    // randomize path widths
	    if (vehicle->demoSelect == 2)
	    {
		const OpenSteer::size_t count = vehicle->path->segmentCount();
		const bool upstream = vehicle->pathFollowDirection > 0;
		const OpenSteer::size_t entryIndex = upstream ? 0 : count-1;
		const OpenSteer::size_t exitIndex  = upstream ? count-1 : 0;
		const float lastExitRadius = vehicle->path->segmentRadius( exitIndex );
		for (OpenSteer::size_t i = 0; i < count; i++)
		{
		    vehicle->path->setSegmentRadius( i, frandom2 (4, 19) );
		}
		vehicle->path->setSegmentRadius( entryIndex, lastExitRadius );
	    }

	    // mark path-boundary map cells as obstacles
	    // (when in path following demo and appropriate mode is set)
	    if (usePathFences && (vehicle->demoSelect == 2))
		drawPathFencesOnMap (*vehicle->map, *vehicle->path);
	}